

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  string *psVar1;
  ostream *poVar2;
  cmGeneratedFileStream fout;
  undefined1 local_260 [584];
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*lg->_vptr_cmLocalGenerator[0xc])(local_260,lg,target);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_260,__return_storage_ptr__,false,None);
  if (((byte)(*(_func_int **)(local_260._0_8_ + -0x18))[(long)(local_260 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_260,"# This is a dummy file for the OBJECT library ");
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar2,"# Don\'t edit, this file will be overwritten.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = lg->GetCurrentBinaryDirectory();
  filename += "/";
  filename += lg->GetTargetDirectory(target);
  filename += "/";
  filename += target->GetName();
  filename += ".objlib";
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}